

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ColumnsFromExprList(Parse *pParse,ExprList *pEList,i16 *pnCol,Column **paCol)

{
  char cVar1;
  void *p;
  uint uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  Column *data;
  char *pcVar4;
  long *plVar5;
  byte *pKey;
  HashElem *pHVar6;
  size_t sVar7;
  ulong uVar8;
  Column *pCVar9;
  byte bVar10;
  u8 *puVar11;
  ushort uVar12;
  ulong uVar13;
  uint uVar14;
  Expr *z;
  ulong uVar15;
  long lVar16;
  u32 cnt;
  Hash ht;
  uint local_84;
  char *local_80;
  ExprList *local_78;
  uint local_6c;
  Column *local_68;
  Column **local_60;
  i16 *local_58;
  ulong local_50;
  Hash local_48;
  
  local_48.htsize = 0;
  local_48.count = 0;
  local_48.first = (HashElem *)0x0;
  local_48.ht = (_ht *)0x0;
  if (pEList == (ExprList *)0x0) {
    *pnCol = 0;
    *paCol = (Column *)0x0;
    data = (Column *)0x0;
LAB_001899be:
    pCVar9 = data;
    pcVar4 = (char *)((long)&(pParse->constraintName).z + 1);
    uVar14 = 0;
  }
  else {
    uVar14 = pEList->nExpr;
    local_78 = pEList;
    data = (Column *)sqlite3DbMallocZero((sqlite3 *)pParse,(long)(int)uVar14 << 5);
    uVar2 = 0x7fff;
    if ((int)uVar14 < 0x7fff) {
      uVar2 = uVar14;
    }
    *pnCol = (i16)uVar2;
    *paCol = data;
    if ((long)(int)uVar14 < 1) goto LAB_001899be;
    local_78 = (ExprList *)local_78->a;
    local_50 = (ulong)uVar2;
    uVar15 = 0;
    local_80 = (char *)((long)&(pParse->constraintName).z + 1);
    local_6c = uVar2;
    local_68 = data;
    local_60 = paCol;
    local_58 = pnCol;
    do {
      pCVar9 = local_68;
      paCol = local_60;
      pnCol = local_58;
      pcVar4 = local_80;
      uVar14 = (uint)uVar15;
      if (*local_80 != '\0') break;
      z = local_78->a[uVar15].pExpr;
      if (z == (Expr *)0x0) {
        puVar11 = &local_78->a[uVar15 - 1].sortOrder;
        for (pcVar4 = *(char **)puVar11; pcVar4 != (char *)0x0; pcVar4 = *(char **)pcVar4) {
          if ((*(uint *)(pcVar4 + 4) >> 0xc & 1) == 0) goto LAB_0018983c;
          if ((*(uint *)(pcVar4 + 4) >> 0x12 & 1) == 0) {
            pcVar4 = pcVar4 + 0x10;
          }
          else {
            pcVar4 = (char *)(*(long *)(pcVar4 + 0x20) + 8);
          }
        }
        pcVar4 = (char *)0x0;
LAB_0018983c:
        for (; cVar1 = *pcVar4, cVar1 == -0x7a; pcVar4 = *(char **)(pcVar4 + 0x18)) {
        }
        if (cVar1 == ';') {
          plVar5 = (long *)(pcVar4 + 8);
        }
        else if (cVar1 == -0x5e) {
          uVar12 = *(ushort *)(pcVar4 + 0x30);
          if ((short)uVar12 < 0) {
            uVar12 = *(ushort *)(*(long *)(pcVar4 + 0x40) + 0x44);
            z = (Expr *)0x2075f0;
            if ((short)uVar12 < 0) goto LAB_00189896;
          }
          plVar5 = (long *)((ulong)uVar12 * 0x20 + *(long *)(*(long *)(pcVar4 + 0x40) + 8));
        }
        else {
          plVar5 = (long *)(puVar11 + 0x10);
        }
        z = (Expr *)*plVar5;
        if (z != (Expr *)0x0) goto LAB_00189896;
        pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"column%d",(ulong)((uint)uVar15 + 1));
      }
      else {
LAB_00189896:
        pKey = (byte *)sqlite3DbStrDup((sqlite3 *)pParse,(char *)z);
      }
      local_84 = 0;
      while (pKey != (byte *)0x0) {
        pHVar6 = findElementWithHash(&local_48,(char *)pKey,(uint *)0x0);
        if (pHVar6->data == (void *)0x0) {
          data->zName = (char *)pKey;
          pCVar9 = (Column *)sqlite3HashInsert(&local_48,(char *)pKey,data);
          if (pCVar9 == data) {
            sqlite3OomFault((sqlite3 *)pParse);
          }
          goto LAB_00189976;
        }
        sVar7 = strlen((char *)pKey);
        if ((sVar7 & 0x3fffffff) == 0) {
          uVar13 = 0;
        }
        else {
          uVar8 = (ulong)((uint)sVar7 & 0x3fffffff);
          do {
            if (uVar8 < 2) {
              bVar10 = *pKey;
              uVar8 = 0;
              break;
            }
            uVar8 = uVar8 - 1;
            bVar10 = pKey[uVar8 & 0xffffffff];
          } while (0xfffffffffffffff5 < (ulong)bVar10 - 0x3a);
          uVar13 = (ulong)((uint)sVar7 & 0x3fffffff);
          if (bVar10 == 0x3a) {
            uVar13 = uVar8 & 0xffffffff;
          }
        }
        local_84 = local_84 + 1;
        pKey = (byte *)sqlite3MPrintf((sqlite3 *)pParse,"%.*z:%u",uVar13,pKey);
        if (3 < local_84) {
          sqlite3_randomness(4,&local_84);
        }
      }
      data->zName = (char *)0x0;
LAB_00189976:
      uVar15 = uVar15 + 1;
      data = data + 1;
      pCVar9 = local_68;
      paCol = local_60;
      pnCol = local_58;
      pcVar4 = local_80;
      uVar14 = local_6c;
    } while (uVar15 != local_50);
  }
  sqlite3HashClear(&local_48);
  if (*pcVar4 == '\0') {
    return extraout_EAX;
  }
  if (uVar14 == 0) {
    iVar3 = extraout_EAX;
    if (pCVar9 == (Column *)0x0) goto LAB_00189a38;
  }
  else {
    lVar16 = 0;
    do {
      p = *(void **)((long)&pCVar9->zName + lVar16);
      if (p != (void *)0x0) {
        sqlite3DbFreeNN((sqlite3 *)pParse,p);
      }
      lVar16 = lVar16 + 0x20;
    } while ((ulong)uVar14 << 5 != lVar16);
  }
  sqlite3DbFreeNN((sqlite3 *)pParse,pCVar9);
  iVar3 = extraout_EAX_00;
LAB_00189a38:
  *paCol = (Column *)0x0;
  *pnCol = 0;
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ColumnsFromExprList(
  Parse *pParse,          /* Parsing context */
  ExprList *pEList,       /* Expr list from which to derive column names */
  i16 *pnCol,             /* Write the number of columns here */
  Column **paCol          /* Write the new column list here */
){
  sqlite3 *db = pParse->db;   /* Database connection */
  int i, j;                   /* Loop counters */
  u32 cnt;                    /* Index added to make the name unique */
  Column *aCol, *pCol;        /* For looping over result columns */
  int nCol;                   /* Number of columns in the result set */
  char *zName;                /* Column name */
  int nName;                  /* Size of name in zName[] */
  Hash ht;                    /* Hash table of column names */

  sqlite3HashInit(&ht);
  if( pEList ){
    nCol = pEList->nExpr;
    aCol = sqlite3DbMallocZero(db, sizeof(aCol[0])*nCol);
    testcase( aCol==0 );
    if( nCol>32767 ) nCol = 32767;
  }else{
    nCol = 0;
    aCol = 0;
  }
  assert( nCol==(i16)nCol );
  *pnCol = nCol;
  *paCol = aCol;

  for(i=0, pCol=aCol; i<nCol && !db->mallocFailed; i++, pCol++){
    /* Get an appropriate name for the column
    */
    if( (zName = pEList->a[i].zName)!=0 ){
      /* If the column contains an "AS <name>" phrase, use <name> as the name */
    }else{
      Expr *pColExpr = sqlite3ExprSkipCollate(pEList->a[i].pExpr);
      while( pColExpr->op==TK_DOT ){
        pColExpr = pColExpr->pRight;
        assert( pColExpr!=0 );
      }
      assert( pColExpr->op!=TK_AGG_COLUMN );
      if( pColExpr->op==TK_COLUMN ){
        /* For columns use the column name name */
        int iCol = pColExpr->iColumn;
        Table *pTab = pColExpr->y.pTab;
        assert( pTab!=0 );
        if( iCol<0 ) iCol = pTab->iPKey;
        zName = iCol>=0 ? pTab->aCol[iCol].zName : "rowid";
      }else if( pColExpr->op==TK_ID ){
        assert( !ExprHasProperty(pColExpr, EP_IntValue) );
        zName = pColExpr->u.zToken;
      }else{
        /* Use the original text of the column expression as its name */
        zName = pEList->a[i].zSpan;
      }
    }
    if( zName ){
      zName = sqlite3DbStrDup(db, zName);
    }else{
      zName = sqlite3MPrintf(db,"column%d",i+1);
    }

    /* Make sure the column name is unique.  If the name is not unique,
    ** append an integer to the name so that it becomes unique.
    */
    cnt = 0;
    while( zName && sqlite3HashFind(&ht, zName)!=0 ){
      nName = sqlite3Strlen30(zName);
      if( nName>0 ){
        for(j=nName-1; j>0 && sqlite3Isdigit(zName[j]); j--){}
        if( zName[j]==':' ) nName = j;
      }
      zName = sqlite3MPrintf(db, "%.*z:%u", nName, zName, ++cnt);
      if( cnt>3 ) sqlite3_randomness(sizeof(cnt), &cnt);
    }
    pCol->zName = zName;
    sqlite3ColumnPropertiesFromName(0, pCol);
    if( zName && sqlite3HashInsert(&ht, zName, pCol)==pCol ){
      sqlite3OomFault(db);
    }
  }
  sqlite3HashClear(&ht);
  if( db->mallocFailed ){
    for(j=0; j<i; j++){
      sqlite3DbFree(db, aCol[j].zName);
    }
    sqlite3DbFree(db, aCol);
    *paCol = 0;
    *pnCol = 0;
    return SQLITE_NOMEM_BKPT;
  }
  return SQLITE_OK;
}